

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::LimitTest::programInfo::~programInfo(programInfo *this)

{
  if (this->m_program_id != 0) {
    (*this->gl->deleteProgram)(this->m_program_id);
    this->m_program_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (*this->gl->deleteShader)(this->m_fragment_shader_id);
    this->m_fragment_shader_id = 0;
  }
  if (this->m_vertex_shader_id != 0) {
    (*this->gl->deleteShader)(this->m_vertex_shader_id);
    this->m_vertex_shader_id = 0;
  }
  return;
}

Assistant:

LimitTest::programInfo::~programInfo()
{
	if (0 != m_program_id)
	{
		gl.deleteProgram(m_program_id);
		m_program_id = 0;
	}

	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);
		m_fragment_shader_id = 0;
	}

	if (0 != m_vertex_shader_id)
	{
		gl.deleteShader(m_vertex_shader_id);
		m_vertex_shader_id = 0;
	}
}